

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void __thiscall
kj::_::DebugExpression<kj::String>::~DebugExpression(DebugExpression<kj::String> *this)

{
  DebugExpression<kj::String> *this_local;
  
  String::~String(&this->value);
  return;
}

Assistant:

DebugExpression(T&& value): value(kj::fwd<T>(value)) {}